

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O0

int FIX::socket_getsockopt(socket_handle s,int opt,int *optval)

{
  int iVar1;
  socklen_t local_20;
  int local_1c;
  socklen_t length;
  int level;
  int *optval_local;
  int opt_local;
  socket_handle s_local;
  
  local_1c = 1;
  if (opt == 1) {
    local_1c = 6;
  }
  local_20 = 4;
  _length = optval;
  optval_local._0_4_ = opt;
  optval_local._4_4_ = s;
  iVar1 = getsockopt(s,local_1c,opt,optval,&local_20);
  return iVar1;
}

Assistant:

int socket_getsockopt(socket_handle s, int opt, int& optval )
{
  int level = SOL_SOCKET;
  if( opt == TCP_NODELAY )
    level = IPPROTO_TCP;

#ifdef _MSC_VER
  int length = sizeof(int);
#else
  socklen_t length = sizeof(socklen_t);
#endif

  return ::getsockopt( s, level, opt, 
                       ( char* ) & optval, & length );
}